

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.hpp
# Opt level: O2

string * __thiscall
njoy::ENDFtk::tree::Material::content_abi_cxx11_(string *__return_storage_ptr__,Material *this)

{
  _Base_ptr p_Var1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  output;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined1 local_68 [32];
  _Head_base<1UL,_double,_false> _Stack_48;
  undefined4 uStack_40;
  undefined4 local_3c;
  int iStack_38;
  int aiStack_34 [5];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (p_Var1 = (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->files_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    File::content_abi_cxx11_((string *)local_68,(File *)&p_Var1[1]._M_parent);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)local_68);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    iStack_38 = 0;
    aiStack_34[0] = 0;
    aiStack_34[1] = 0;
    _Stack_48._M_head_impl = 0.0;
    uStack_40 = 0;
    local_3c = 0;
    local_68._16_8_ = 0;
    local_68._24_8_ = 0;
    local_68._0_8_ = (pointer)0x0;
    local_68._8_8_ = 0;
    local_70.container = __return_storage_ptr__;
    StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>
              ((StructureDivision *)local_68,&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

auto content() const {

      std::string content;
      for ( const auto& file : this->files() ) {

        content += file.content();
      }

      if ( content.size() ) {

        auto output = std::back_inserter( content );
        MEND().print( output );
      }

      return content;
    }